

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O0

void StoreGray(fixed_y_t *rgb,fixed_y_t *y,int w)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int i;
  undefined4 local_18;
  
  local_18 = 0;
  do {
    iVar1 = RGBToGray((ulong)*(ushort *)(in_RDI + (long)local_18 * 2),
                      (ulong)*(ushort *)(in_RDI + (long)(in_EDX + local_18) * 2),
                      (ulong)*(ushort *)(in_RDI + (long)(in_EDX * 2 + local_18) * 2));
    *(short *)(in_RSI + (long)local_18 * 2) = (short)iVar1;
    local_18 = local_18 + 1;
  } while (local_18 < in_EDX);
  return;
}

Assistant:

static void StoreGray(const fixed_y_t* rgb, fixed_y_t* y, int w) {
  int i = 0;
  assert(w > 0);
  do {
    y[i] = RGBToGray(rgb[0 * w + i], rgb[1 * w + i], rgb[2 * w + i]);
  } while (++i < w);
}